

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O0

RGBA tcu::anon_unknown_0::readRGBA8(ConstPixelBufferAccess *src,deUint32 x,deUint32 y)

{
  deUint8 dVar1;
  deUint8 dVar2;
  deUint8 dVar3;
  deUint8 dVar4;
  deUint32 color;
  deUint32 res;
  deUint32 raw;
  deUint32 y_local;
  deUint32 x_local;
  ConstPixelBufferAccess *src_local;
  
  color = readRGBA8Raw(src,x,y);
  dVar1 = getChannel<0>(color);
  dVar2 = getChannel<1>(color);
  dVar3 = getChannel<2>(color);
  dVar4 = getChannel<3>(color);
  RGBA::RGBA((RGBA *)((long)&src_local + 4),CONCAT13(dVar4,CONCAT12(dVar3,CONCAT11(dVar2,dVar1))));
  return (RGBA)src_local._4_4_;
}

Assistant:

inline RGBA readRGBA8 (const ConstPixelBufferAccess& src, deUint32 x, deUint32 y)
{
	deUint32 raw = readRGBA8Raw(src, x, y);
	deUint32 res = 0;

	res |= getChannel<0>(raw) << RGBA::RED_SHIFT;
	res |= getChannel<1>(raw) << RGBA::GREEN_SHIFT;
	res |= getChannel<2>(raw) << RGBA::BLUE_SHIFT;
	res |= getChannel<3>(raw) << RGBA::ALPHA_SHIFT;

	return RGBA(res);
}